

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::MVNParameter::Clear(MVNParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->across_channels_ = false;
    this->normalize_variance_ = true;
    this->eps_ = 1e-09;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void MVNParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.MVNParameter)
  if (_has_bits_[0 / 32] & 7u) {
    across_channels_ = false;
    normalize_variance_ = true;
    eps_ = 1e-09f;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}